

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBoxAlgo.cpp
# Opt level: O0

void testBoxAlgo(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing box algorithms");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_355c8::entryAndExitPoints1();
  anon_unknown.dwarf_355c8::entryAndExitPoints2();
  anon_unknown.dwarf_355c8::rayBoxIntersection1();
  anon_unknown.dwarf_355c8::rayBoxIntersection2();
  anon_unknown.dwarf_355c8::boxMatrixTransform();
  anon_unknown.dwarf_355c8::pointInAndOnBox();
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testBoxAlgo ()
{
    cout << "Testing box algorithms" << endl;

    entryAndExitPoints1 ();
    entryAndExitPoints2 ();
    rayBoxIntersection1 ();
    rayBoxIntersection2 ();
    boxMatrixTransform ();
    pointInAndOnBox ();

    cout << "ok\n" << endl;
}